

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  undefined8 *puVar1;
  size_type *psVar2;
  tm *ptVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  string local_250;
  undefined1 local_230 [8];
  tm time_struct;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  local_f0 = (ulong *)((long)this / 1000);
  ptVar3 = localtime_r((time_t *)&local_f0,(tm *)local_230);
  if (ptVar3 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  time_struct.tm_zone._4_4_ = time_struct.tm_mday + 0x76c;
  StreamableToString<int>(&local_250,(int *)((long)&time_struct.tm_zone + 4));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_100 = *puVar6;
    lStack_f8 = plVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar6;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1f0,(String *)(ulong)(time_struct.tm_hour + 1),(int)local_108);
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < local_1f0._M_string_length + local_108) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      uVar8 = local_1f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_1f0._M_string_length + local_108) goto LAB_0012693a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0012693a:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_1f0._M_dataplus._M_p);
  }
  local_70 = &local_60;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar5[3];
  }
  else {
    local_60 = *puVar1;
    local_70 = (undefined8 *)*puVar5;
  }
  local_68 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_40 = *puVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar6;
    local_50 = (ulong *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1d0,(String *)(ulong)(uint)time_struct.tm_min,(int)local_48);
  uVar7 = 0xf;
  if (local_50 != &local_40) {
    uVar7 = local_40;
  }
  if (uVar7 < local_1d0._M_string_length + local_48) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar8 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_1d0._M_string_length + local_48) goto LAB_00126a4a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_00126a4a:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_1d0._M_dataplus._M_p);
  }
  local_90 = &local_80;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_120 = *puVar6;
    lStack_118 = plVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar6;
    local_130 = (ulong *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1b0,(String *)(ulong)(uint)time_struct.tm_sec,(int)local_128);
  uVar7 = 0xf;
  if (local_130 != &local_120) {
    uVar7 = local_120;
  }
  if (uVar7 < local_1b0._M_string_length + local_128) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      uVar8 = local_1b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_1b0._M_string_length + local_128) goto LAB_00126b74;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00126b74:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_1b0._M_dataplus._M_p);
  }
  local_b0 = &local_a0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar5[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar5;
  }
  local_a8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_140 = *puVar6;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar6;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_190,(String *)(ulong)(uint)local_230._4_4_,(int)local_148);
  uVar7 = 0xf;
  if (local_150 != &local_140) {
    uVar7 = local_140;
  }
  if (uVar7 < local_190._M_string_length + local_148) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      uVar8 = local_190.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_190._M_string_length + local_148) goto LAB_00126ca9;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00126ca9:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_190._M_dataplus._M_p);
  }
  local_d0 = &local_c0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar5[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar5;
  }
  local_c8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_e0 = *puVar6;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar6;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_170,(String *)(ulong)(uint)local_230._0_4_,(int)local_e8);
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < local_170._M_string_length + local_e8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      uVar8 = local_170.field_2._M_allocated_capacity;
    }
    if (local_170._M_string_length + local_e8 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00126e05;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_170._M_dataplus._M_p);
LAB_00126e05:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar8 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}